

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O0

void __thiscall
kainjow::mustache::
component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
component(component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t,
         string_size_type p)

{
  string_size_type p_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_local;
  component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)t);
  mstch_tag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  mstch_tag(&this->tag);
  Catch::clara::std::
  vector<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&this->children);
  this->position = p;
  return;
}

Assistant:

component(const string_type& t, string_size_type p) : text(t), position(p) {}